

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5ExprCheckPoslists(Fts5ExprNode *pNode,i64 iRowid)

{
  int iVar1;
  int iVar2;
  int bRet;
  int i;
  long lVar3;
  
  pNode->iRowid = iRowid;
  pNode->bEof = 0;
  switch(pNode->eType) {
  case 1:
    iVar2 = 0;
    for (lVar3 = 0; lVar3 < pNode->nChild; lVar3 = lVar3 + 1) {
      iVar1 = fts5ExprCheckPoslists(pNode->apChild[lVar3],iRowid);
      if (iVar1 != 0) {
        iVar2 = 1;
      }
    }
    return iVar2;
  case 2:
    lVar3 = 0;
    do {
      if (pNode->nChild <= lVar3) {
        return 1;
      }
      iVar2 = fts5ExprCheckPoslists(pNode->apChild[lVar3],iRowid);
      lVar3 = lVar3 + 1;
    } while (iVar2 != 0);
    break;
  default:
    iVar2 = fts5ExprCheckPoslists(pNode->apChild[0],iRowid);
    if ((iVar2 != 0) &&
       (iVar2 = fts5ExprCheckPoslists(*(Fts5ExprNode **)(pNode + 1),iRowid), iVar2 == 0)) {
      return 1;
    }
    break;
  case 4:
  case 9:
    return (uint)(0 < (pNode->pNear->apPhrase[0]->poslist).n);
  }
  fts5ExprClearPoslists(pNode);
  return 0;
}

Assistant:

static int fts5ExprCheckPoslists(Fts5ExprNode *pNode, i64 iRowid){
  pNode->iRowid = iRowid;
  pNode->bEof = 0;
  switch( pNode->eType ){
    case FTS5_TERM:
    case FTS5_STRING:
      return (pNode->pNear->apPhrase[0]->poslist.n>0);

    case FTS5_AND: {
      int i;
      for(i=0; i<pNode->nChild; i++){
        if( fts5ExprCheckPoslists(pNode->apChild[i], iRowid)==0 ){
          fts5ExprClearPoslists(pNode);
          return 0;
        }
      }
      break;
    }

    case FTS5_OR: {
      int i;
      int bRet = 0;
      for(i=0; i<pNode->nChild; i++){
        if( fts5ExprCheckPoslists(pNode->apChild[i], iRowid) ){
          bRet = 1;
        }
      }
      return bRet;
    }

    default: {
      assert( pNode->eType==FTS5_NOT );
      if( 0==fts5ExprCheckPoslists(pNode->apChild[0], iRowid)
          || 0!=fts5ExprCheckPoslists(pNode->apChild[1], iRowid)
        ){
        fts5ExprClearPoslists(pNode);
        return 0;
      }
      break;
    }
  }
  return 1;
}